

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O3

void test_dt_positiveInteger(void)

{
  char cVar1;
  XSValue_Data expValue;
  XSValue_Data expValue_00;
  char cVar2;
  bool bVar3;
  XSValue_Data *pXVar4;
  XSValue *pXVar5;
  wchar16 *pwVar6;
  char *pcVar7;
  long lVar8;
  bool bVar9;
  void *pvVar10;
  char *pcVar11;
  Status myStatus;
  char data_canrep_1 [2];
  Status myStatus_11;
  char lex_v_ran_iv_1 [2];
  char lex_iv_2 [8];
  char lex_iv_1 [10];
  char data_canrep_2 [6];
  char data_rawstr_2 [10];
  char data_rawstr_1 [8];
  char lex_v_ran64_iv_2 [22];
  char lex_v_ran64_v_2 [22];
  char lex_v_ran_v_1 [12];
  char lex_v_ran64_iv_2_canrep [21];
  char lex_v_ran64_v_2_canrep [21];
  StrX local_198;
  char *local_188;
  char local_17a [2];
  Status local_178;
  char local_172 [2];
  undefined8 local_170;
  char local_168 [16];
  char local_158 [8];
  char local_150 [16];
  char local_140 [8];
  undefined8 local_138;
  undefined6 uStack_130;
  undefined2 uStack_12a;
  undefined6 uStack_128;
  char local_118 [32];
  char local_f8 [16];
  char local_e8 [32];
  char local_c8 [24];
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  builtin_strncpy(local_f8,"   1234   \n",0xc);
  local_172[0] = '0';
  local_172[1] = '\0';
  builtin_strncpy(local_118,"+18446744073709551615",0x16);
  local_138._0_1_ = '+';
  local_138._1_1_ = '1';
  local_138._2_1_ = '8';
  local_138._3_1_ = '4';
  local_138._4_1_ = '4';
  local_138._5_1_ = '6';
  local_138._6_1_ = '7';
  local_138._7_1_ = '4';
  uStack_130 = 0x303733373034;
  uStack_12a = 0x3539;
  uStack_128 = 0x3631363135;
  builtin_strncpy(local_c8 + 0x10,"1615",5);
  builtin_strncpy(local_c8,"1844674407370955",0x10);
  builtin_strncpy(local_e8 + 0x10,"1616",5);
  builtin_strncpy(local_e8,"1844674407370955",0x10);
  builtin_strncpy(local_168,"12b34.456",10);
  local_170 = 0x36356234333231;
  builtin_strncpy(local_140,"  +1  \n",8);
  local_17a[0] = '1';
  local_17a[1] = '\0';
  builtin_strncpy(local_150,"+00012345",10);
  builtin_strncpy(local_158,"12345",6);
  local_188 = (char *)((ulong)local_188 & 0xffffffff00000000);
  local_198.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_f8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_198.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_f8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_198.fUnicodeForm,dt_positiveInteger,(Status *)&local_188,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_198);
  if (cVar2 == '\0') {
    StrX::StrX(&local_198,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_POSITIVEINTEGER);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xc32,local_f8,local_198.fLocalForm,1);
    StrX::~StrX(&local_198);
    errSeen = 1;
  }
  local_188 = (char *)((ulong)local_188 & 0xffffffff00000000);
  local_198.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_172,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_198.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_172,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_198.fUnicodeForm,dt_positiveInteger,(Status *)&local_188,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_198);
  if (cVar2 == '\0') {
    if ((int)local_188 != 6) {
      StrX::StrX(&local_198,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_POSITIVEINTEGER);
      if (((ulong)local_188 & 0xffffffff) < 0xb) {
        pcVar11 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_188 & 0xffffffff];
      }
      else {
        pcVar11 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xc33,local_172,local_198.fLocalForm,"st_FOCA0002",pcVar11);
      goto LAB_0011c5ae;
    }
  }
  else {
    StrX::StrX(&local_198,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_POSITIVEINTEGER);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xc33,local_172,local_198.fLocalForm,0);
LAB_0011c5ae:
    StrX::~StrX(&local_198);
    errSeen = 1;
  }
  local_188 = (char *)((ulong)local_188 & 0xffffffff00000000);
  local_198.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_118,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_198.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_118,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_198.fUnicodeForm,dt_positiveInteger,(Status *)&local_188,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_198);
  if (cVar2 == '\0') {
    StrX::StrX(&local_198,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_POSITIVEINTEGER);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xc35,local_118,local_198.fLocalForm,1);
    StrX::~StrX(&local_198);
    errSeen = 1;
  }
  local_188 = (char *)((ulong)local_188 & 0xffffffff00000000);
  local_198.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         ((char *)&local_138,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_198.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ((char *)&local_138,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_198.fUnicodeForm,dt_positiveInteger,(Status *)&local_188,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_198);
  if (cVar2 == '\0') {
    StrX::StrX(&local_198,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_POSITIVEINTEGER);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xc36,&local_138,local_198.fLocalForm,1);
    StrX::~StrX(&local_198);
    errSeen = 1;
  }
  local_188 = (char *)((ulong)local_188 & 0xffffffff00000000);
  local_198.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_168,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_198.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_168,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_198.fUnicodeForm,dt_positiveInteger,(Status *)&local_188,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_198);
  if (cVar2 == '\0') {
    if ((int)local_188 != 6) {
      StrX::StrX(&local_198,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_POSITIVEINTEGER);
      if (((ulong)local_188 & 0xffffffff) < 0xb) {
        pcVar11 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_188 & 0xffffffff];
      }
      else {
        pcVar11 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xc39,local_168,local_198.fLocalForm,"st_FOCA0002",pcVar11);
      goto LAB_0011c7fa;
    }
  }
  else {
    StrX::StrX(&local_198,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_POSITIVEINTEGER);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xc39,local_168,local_198.fLocalForm,0);
LAB_0011c7fa:
    StrX::~StrX(&local_198);
    errSeen = 1;
  }
  local_188 = (char *)((ulong)local_188 & 0xffffffff00000000);
  local_198.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         ((char *)&local_170,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_198.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ((char *)&local_170,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_198.fUnicodeForm,dt_positiveInteger,(Status *)&local_188,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_198);
  if (cVar2 == '\0') {
    if ((int)local_188 == 6) goto LAB_0011c903;
    StrX::StrX(&local_198,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_POSITIVEINTEGER);
    if (((ulong)local_188 & 0xffffffff) < 0xb) {
      pcVar11 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_188 & 0xffffffff];
    }
    else {
      pcVar11 = "st_UnknownType";
    }
    printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
           ,0xc3a,&local_170,local_198.fLocalForm,"st_FOCA0002",pcVar11);
  }
  else {
    StrX::StrX(&local_198,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_POSITIVEINTEGER);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xc3a,&local_170,local_198.fLocalForm,0);
  }
  StrX::~StrX(&local_198);
  errSeen = 1;
LAB_0011c903:
  bVar9 = true;
  do {
    local_188 = (char *)((ulong)local_188 & 0xffffffff00000000);
    local_198.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_f8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_198.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_f8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar10 = (void *)0x2b;
    pXVar4 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_198.fUnicodeForm,dt_positiveInteger,(Status *)&local_188,ver_10,bVar9,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_198);
    if (pXVar4 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_198,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_POSITIVEINTEGER);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xc57,local_f8);
      StrX::~StrX(&local_198);
      errSeen = 1;
    }
    else {
      uStack_80 = 0x4d2;
      local_68 = local_38;
      local_78 = local_48;
      uStack_70 = uStack_40;
      expValue.fValue.f_long = 0x4d2;
      expValue._0_8_ = local_88;
      expValue.fValue._8_8_ = local_48;
      expValue.fValue._16_8_ = uStack_40;
      expValue.fValue.f_datetime.f_milisec = (double)local_38;
      bVar3 = compareActualValue(dt_positiveInteger,*pXVar4,expValue);
      if (!bVar3) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar10);
    }
    local_188 = (char *)((ulong)local_188 & 0xffffffff00000000);
    local_198.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_118,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_198.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_118,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar10 = (void *)0x2b;
    pXVar4 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_198.fUnicodeForm,dt_positiveInteger,(Status *)&local_188,ver_10,bVar9,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_198);
    if (pXVar4 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_198,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_POSITIVEINTEGER);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xc59,local_118);
      StrX::~StrX(&local_198);
      errSeen = 1;
    }
    else {
      uStack_a8 = 0xffffffffffffffff;
      local_90 = local_50;
      local_a0 = local_60;
      uStack_98 = uStack_58;
      expValue_00.fValue.f_long = 0xffffffffffffffff;
      expValue_00._0_8_ = local_b0;
      expValue_00.fValue._8_8_ = local_60;
      expValue_00.fValue._16_8_ = uStack_58;
      expValue_00.fValue.f_datetime.f_milisec = (double)local_50;
      bVar3 = compareActualValue(dt_positiveInteger,*pXVar4,expValue_00);
      if (!bVar3) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar10);
    }
    local_188 = (char *)((ulong)local_188 & 0xffffffff00000000);
    local_198.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           ((char *)&local_138,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_198.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ((char *)&local_138,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_198.fUnicodeForm,dt_positiveInteger,(Status *)&local_188,ver_10,bVar9,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_198);
    if (pXVar5 == (XSValue *)0x0) {
      if ((int)local_188 != 8) {
        StrX::StrX(&local_198,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_POSITIVEINTEGER);
        pcVar11 = "st_UnknownType";
        if (((ulong)local_188 & 0xffffffff) < 0xb) {
          pcVar11 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_188 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xc5a,&local_138,local_198.fLocalForm,"st_FOCA0003",pcVar11);
        StrX::~StrX(&local_198);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_198,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_POSITIVEINTEGER);
      pvVar10 = (void *)0xc5a;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xc5a,&local_138);
      StrX::~StrX(&local_198);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
    }
    local_188 = (char *)((ulong)local_188 & 0xffffffff00000000);
    local_198.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_168,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_198.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_168,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_198.fUnicodeForm,dt_positiveInteger,(Status *)&local_188,ver_10,bVar9,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_198);
    if (pXVar5 == (XSValue *)0x0) {
      if ((int)local_188 != 6) {
        StrX::StrX(&local_198,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_POSITIVEINTEGER);
        pcVar11 = "st_UnknownType";
        if (((ulong)local_188 & 0xffffffff) < 0xb) {
          pcVar11 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_188 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xc5c,local_168,local_198.fLocalForm,"st_FOCA0002",pcVar11);
        StrX::~StrX(&local_198);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_198,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_POSITIVEINTEGER);
      pvVar10 = (void *)0xc5c;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xc5c,local_168);
      StrX::~StrX(&local_198);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
    }
    local_188 = (char *)((ulong)local_188 & 0xffffffff00000000);
    local_198.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           ((char *)&local_170,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_198.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ((char *)&local_170,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_198.fUnicodeForm,dt_positiveInteger,(Status *)&local_188,ver_10,bVar9,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_198);
    if (pXVar5 == (XSValue *)0x0) {
      if ((int)local_188 != 6) {
        StrX::StrX(&local_198,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_POSITIVEINTEGER);
        pcVar11 = "st_UnknownType";
        if (((ulong)local_188 & 0xffffffff) < 0xb) {
          pcVar11 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_188 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xc5d,&local_170,local_198.fLocalForm,"st_FOCA0002",pcVar11);
        StrX::~StrX(&local_198);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_198,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_POSITIVEINTEGER);
      pvVar10 = (void *)0xc5d;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xc5d,&local_170);
      StrX::~StrX(&local_198);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
    }
    bVar3 = bVar9 != false;
    bVar9 = false;
  } while (bVar3);
  bVar9 = true;
  do {
    local_178 = st_Init;
    local_198.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_140,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_198.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_140,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar6 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_198.fUnicodeForm,dt_positiveInteger,&local_178,ver_10,bVar9,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_198);
    if (pwVar6 == (wchar16 *)0x0) {
      StrX::StrX(&local_198,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_POSITIVEINTEGER);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xc7b,local_140);
      StrX::~StrX(&local_198);
      errSeen = 1;
    }
    else {
      local_188 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar11 = local_17a;
      if (local_188 != pcVar11) {
        pcVar7 = local_188;
        if (local_188 == (char *)0x0) {
LAB_0011cfa0:
          if (*pcVar11 == '\0') goto LAB_0011cfed;
        }
        else {
          do {
            cVar2 = *pcVar7;
            if (cVar2 == '\0') goto LAB_0011cfa0;
            pcVar7 = pcVar7 + 1;
            cVar1 = *pcVar11;
            pcVar11 = pcVar11 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_198,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_POSITIVEINTEGER);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xc7b,local_140,local_198.fLocalForm,local_188,local_17a);
        StrX::~StrX(&local_198);
        errSeen = 1;
      }
LAB_0011cfed:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar6);
      xercesc_4_0::XMLString::release(&local_188,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_178 = st_Init;
    local_198.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_150,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_198.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_150,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar6 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_198.fUnicodeForm,dt_positiveInteger,&local_178,ver_10,bVar9,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_198);
    if (pwVar6 == (wchar16 *)0x0) {
      StrX::StrX(&local_198,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_POSITIVEINTEGER);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xc7c,local_150);
      StrX::~StrX(&local_198);
      errSeen = 1;
    }
    else {
      local_188 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar11 = local_158;
      if (local_188 != pcVar11) {
        pcVar7 = local_188;
        if (local_188 == (char *)0x0) {
LAB_0011d0e0:
          if (*pcVar11 == '\0') goto LAB_0011d130;
        }
        else {
          do {
            cVar2 = *pcVar7;
            if (cVar2 == '\0') goto LAB_0011d0e0;
            pcVar7 = pcVar7 + 1;
            cVar1 = *pcVar11;
            pcVar11 = pcVar11 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_198,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_POSITIVEINTEGER);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xc7c,local_150,local_198.fLocalForm,local_188,local_158);
        StrX::~StrX(&local_198);
        errSeen = 1;
      }
LAB_0011d130:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar6);
      xercesc_4_0::XMLString::release(&local_188,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_178 = st_Init;
    local_198.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_118,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_198.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_118,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar6 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_198.fUnicodeForm,dt_positiveInteger,&local_178,ver_10,bVar9,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_198);
    if (pwVar6 == (wchar16 *)0x0) {
      StrX::StrX(&local_198,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_POSITIVEINTEGER);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xc7e,local_118);
      StrX::~StrX(&local_198);
      errSeen = 1;
    }
    else {
      local_188 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar11 = local_c8;
      if (local_188 != pcVar11) {
        pcVar7 = local_188;
        if (local_188 == (char *)0x0) {
LAB_0011d223:
          if (*pcVar11 == '\0') goto LAB_0011d273;
        }
        else {
          do {
            cVar2 = *pcVar7;
            if (cVar2 == '\0') goto LAB_0011d223;
            pcVar7 = pcVar7 + 1;
            cVar1 = *pcVar11;
            pcVar11 = pcVar11 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_198,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_POSITIVEINTEGER);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xc7e,local_118,local_198.fLocalForm,local_188,local_c8);
        StrX::~StrX(&local_198);
        errSeen = 1;
      }
LAB_0011d273:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar6);
      xercesc_4_0::XMLString::release(&local_188,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_178 = st_Init;
    local_198.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           ((char *)&local_138,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_198.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ((char *)&local_138,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar6 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_198.fUnicodeForm,dt_positiveInteger,&local_178,ver_10,bVar9,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_198);
    if (pwVar6 == (wchar16 *)0x0) {
      StrX::StrX(&local_198,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_POSITIVEINTEGER);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xc7f,&local_138);
      StrX::~StrX(&local_198);
      errSeen = 1;
    }
    else {
      local_188 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar11 = local_e8;
      if (local_188 != pcVar11) {
        pcVar7 = local_188;
        if (local_188 == (char *)0x0) {
LAB_0011d366:
          if (*pcVar11 == '\0') goto LAB_0011d3b6;
        }
        else {
          do {
            cVar2 = *pcVar7;
            if (cVar2 == '\0') goto LAB_0011d366;
            pcVar7 = pcVar7 + 1;
            cVar1 = *pcVar11;
            pcVar11 = pcVar11 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_198,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_POSITIVEINTEGER);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xc7f,&local_138,local_198.fLocalForm,local_188,local_e8);
        StrX::~StrX(&local_198);
        errSeen = 1;
      }
LAB_0011d3b6:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar6);
      xercesc_4_0::XMLString::release(&local_188,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_188 = (char *)((ulong)local_188 & 0xffffffff00000000);
    local_198.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_168,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_198.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_168,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar8 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_198.fUnicodeForm,dt_positiveInteger,(Status *)&local_188,ver_10,bVar9,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_198);
    if (lVar8 == 0) {
      if ((int)local_188 != 6) {
        StrX::StrX(&local_198,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_POSITIVEINTEGER);
        pcVar11 = "st_UnknownType";
        if (((ulong)local_188 & 0xffffffff) < 0xb) {
          pcVar11 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_188 & 0xffffffff];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0xc80,local_168,local_198.fLocalForm,"st_FOCA0002",pcVar11);
        StrX::~StrX(&local_198);
        goto LAB_0011d4d1;
      }
    }
    else {
      StrX::StrX(&local_198,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_POSITIVEINTEGER);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xc80,local_168);
      StrX::~StrX(&local_198);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar8);
LAB_0011d4d1:
      errSeen = 1;
    }
    local_188 = (char *)((ulong)local_188 & 0xffffffff00000000);
    local_198.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           ((char *)&local_170,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_198.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ((char *)&local_170,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar8 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_198.fUnicodeForm,dt_positiveInteger,(Status *)&local_188,ver_10,bVar9,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_198);
    if (lVar8 == 0) {
      if ((int)local_188 != 6) {
        StrX::StrX(&local_198,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_POSITIVEINTEGER);
        pcVar11 = "st_UnknownType";
        if (((ulong)local_188 & 0xffffffff) < 0xb) {
          pcVar11 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_188 & 0xffffffff];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0xc81,&local_170,local_198.fLocalForm,"st_FOCA0002",pcVar11);
        StrX::~StrX(&local_198);
        goto LAB_0011d5d1;
      }
    }
    else {
      StrX::StrX(&local_198,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_POSITIVEINTEGER);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xc81,&local_170);
      StrX::~StrX(&local_198);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar8);
LAB_0011d5d1:
      errSeen = 1;
    }
    bVar3 = bVar9 == false;
    bVar9 = false;
    if (bVar3) {
      return;
    }
  } while( true );
}

Assistant:

void test_dt_positiveInteger()
{
    const XSValue::DataType dt = XSValue::dt_positiveInteger;
    bool  toValidate = true;

    const char lex_v_ran_v_1[]="   1234   \n";
    const char lex_v_ran_iv_1[]="0";

    const char lex_v_ran64_v_2[]="+18446744073709551615";
    const char lex_v_ran64_iv_2[]="+18446744073709551616";

    XSValue::XSValue_Data act_v_ran_v_1;    act_v_ran_v_1.fValue.f_ulong = (uint64_t)1234ull;
    XSValue::XSValue_Data act_v_ran64_v_2;  act_v_ran64_v_2.fValue.f_ulong = (uint64_t)18446744073709551615ull;
    XSValue::XSValue_Data act_v_ran32_v_2;  act_v_ran32_v_2.fValue.f_ulong = (uint64_t)4294967295ull;

    const char lex_v_ran64_v_2_canrep[]="18446744073709551615";
    const char lex_v_ran64_iv_2_canrep[]="18446744073709551616";

    const char lex_iv_1[]="12b34.456";
    const char lex_iv_2[]="1234b56";

/***
 * 3.3.25.2 Canonical representation
 *
 * The canonical representation for positiveInteger is defined by prohibiting certain options from the
 * Lexical representation (3.3.25.1). Specifically,
 * 1. the optional "+" sign is prohibited and
 * 2. leading zeroes are prohibited.
 *
 ***/

    const char data_rawstr_1[]="  +1  \n";
    const char data_canrep_1[]="1";
    const char data_rawstr_2[]="+00012345";
    const char data_canrep_2[]="12345";

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *    lexical valid
     *            range  valid                           true              n/a
     *            range  invalid       n/a
     *    lexical invalid                                false           st_FOCA0002
     *
     ***/

    // lexical valid
    VALIDATE_TEST(lex_v_ran_v_1    , dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(lex_v_ran_iv_1   , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    VALIDATE_TEST(lex_v_ran64_v_2  , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran64_iv_2 , dt, EXP_RET_VALID_TRUE, DONT_CARE);

    // lexical invalid
    VALIDATE_TEST(lex_iv_1         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(lex_iv_2         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        ACTVALUE_TEST(lex_v_ran_v_1,    dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_1);

        ACTVALUE_TEST(lex_v_ran64_v_2 , dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran64_v_2);
        ACTVALUE_TEST(lex_v_ran64_iv_2, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0003, act_v_ran64_v_2);

        ACTVALUE_TEST(lex_iv_1,         dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran32_v_2);
        ACTVALUE_TEST(lex_iv_2,         dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran32_v_2);
    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XMLCh          n/a
     *          range  invalid          n/a
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XMLCh         n/a
     *          range  invalid          n/a
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j)? true : false;

        CANREP_TEST(data_rawstr_1,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_1,    DONT_CARE);
        CANREP_TEST(data_rawstr_2,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_2,    DONT_CARE);

        CANREP_TEST(lex_v_ran64_v_2,  dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran64_v_2_canrep,  DONT_CARE);
        CANREP_TEST(lex_v_ran64_iv_2, dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran64_iv_2_canrep, DONT_CARE);
        CANREP_TEST(lex_iv_1        , dt, toValidate, EXP_RET_CANREP_FALSE, null_string,      XSValue::st_FOCA0002);
        CANREP_TEST(lex_iv_2        , dt, toValidate, EXP_RET_CANREP_FALSE, null_string,      XSValue::st_FOCA0002);

    }

}